

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O2

Float pbrt::CatmullRom(span<const_float> nodes,span<const_float> values,Float x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  float *pfVar9;
  float *pfVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  Float FVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  size_t vb;
  size_t va;
  
  va = nodes.n;
  pfVar10 = nodes.ptr;
  vb = values.n;
  pfVar9 = values.ptr;
  if (va != vb) {
    LogFatal<char_const(&)[13],char_const(&)[14],char_const(&)[13],unsigned_long&,char_const(&)[14],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math.cpp"
               ,0xb5,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])"nodes.size()",
               (char (*) [14])"values.size()",(char (*) [13])"nodes.size()",&va,
               (char (*) [14])"values.size()",&vb);
  }
  if ((x < *pfVar10) || (pfVar10[va - 1] < x)) {
    FVar15 = 0.0;
  }
  else {
    uVar8 = va - 2;
    lVar14 = 1;
    uVar11 = uVar8;
    while (uVar13 = uVar11, 0 < (long)uVar13) {
      uVar11 = uVar13 >> 1;
      if (pfVar10[(int)uVar11 + (int)lVar14] <= x) {
        lVar14 = uVar11 + 1 + lVar14;
        uVar11 = ~uVar11 + uVar13;
      }
    }
    if (lVar14 - 1U < uVar8) {
      uVar8 = lVar14 - 1U;
    }
    uVar11 = 0;
    if (0 < lVar14) {
      uVar11 = uVar8;
    }
    iVar12 = (int)uVar11;
    fVar1 = pfVar10[iVar12];
    fVar2 = pfVar9[iVar12];
    lVar14 = (long)((uVar11 << 0x20) + 0x100000000) >> 0x1e;
    fVar17 = *(float *)((long)pfVar10 + lVar14);
    fVar3 = *(float *)((long)pfVar9 + lVar14);
    fVar16 = fVar17 - fVar1;
    if (iVar12 < 1) {
      fVar17 = fVar3 - fVar2;
    }
    else {
      fVar17 = (fVar16 * (fVar3 - pfVar9[iVar12 - 1U])) / (fVar17 - pfVar10[iVar12 - 1U]);
    }
    uVar8 = (long)((uVar11 << 0x20) + 0x200000000) >> 0x20;
    if (uVar8 < va) {
      auVar18._0_4_ = (fVar16 * (pfVar9[uVar8] - fVar2)) / (pfVar10[uVar8] - fVar1);
      auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
    }
    else {
      auVar18 = ZEXT416((uint)(fVar3 - fVar2));
    }
    fVar16 = (x - fVar1) / fVar16;
    fVar1 = fVar16 * fVar16;
    fVar4 = fVar16 * fVar1;
    auVar7 = vfmsub213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)fVar4),
                             ZEXT416((uint)(fVar1 * 3.0)));
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * 3.0)),ZEXT416((uint)fVar4),
                             SUB6416(ZEXT464(0xc0000000),0));
    auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar1),
                             ZEXT416((uint)fVar4));
    auVar6 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)(auVar7._0_4_ + 1.0)),
                             ZEXT416((uint)(fVar3 * auVar6._0_4_)));
    auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar17),ZEXT416((uint)(auVar5._0_4_ + fVar16)),auVar6);
    auVar18 = vfmadd213ss_fma(ZEXT416((uint)(fVar4 - fVar1)),auVar18,auVar5);
    FVar15 = auVar18._0_4_;
  }
  return FVar15;
}

Assistant:

Float CatmullRom(pstd::span<const Float> nodes, pstd::span<const Float> values, Float x) {
    CHECK_EQ(nodes.size(), values.size());
    if (!(x >= nodes.front() && x <= nodes.back()))
        return 0;
    int idx = FindInterval(nodes.size(), [&](int i) { return nodes[i] <= x; });
    Float x0 = nodes[idx], x1 = nodes[idx + 1];
    Float f0 = values[idx], f1 = values[idx + 1];
    Float width = x1 - x0;
    Float d0, d1;
    if (idx > 0)
        d0 = width * (f1 - values[idx - 1]) / (x1 - nodes[idx - 1]);
    else
        d0 = f1 - f0;

    if (idx + 2 < nodes.size())
        d1 = width * (values[idx + 2] - f0) / (nodes[idx + 2] - x0);
    else
        d1 = f1 - f0;

    Float t = (x - x0) / (x1 - x0), t2 = t * t, t3 = t2 * t;
    return (2 * t3 - 3 * t2 + 1) * f0 + (-2 * t3 + 3 * t2) * f1 + (t3 - 2 * t2 + t) * d0 +
           (t3 - t2) * d1;
}